

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O2

int fsetline(FILE *file,int linenumber)

{
  long lVar1;
  char *__s;
  size_t sVar2;
  int iVar3;
  int local_440;
  char line [1024];
  
  iVar3 = 1;
  if (0 < linenumber) {
    lVar1 = ftell((FILE *)file);
    rewind((FILE *)file);
    for (iVar3 = 0; iVar3 != linenumber + -1; iVar3 = iVar3 + 1) {
      do {
        __s = fgets(line,0x400,(FILE *)file);
        if (__s == (char *)0x0) {
          clearerr((FILE *)file);
          local_440 = (int)lVar1;
          fseek((FILE *)file,(long)local_440,0);
          return 1;
        }
        sVar2 = strlen(__s);
      } while ((sVar2 == 0x3ff) && (__s[0x3fe] != '\n'));
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

inline int fsetline(FILE* file, int linenumber)
{ 
	int cur = 0, i = 0;
	char* r = NULL;
	char line[1024];

	if (linenumber <= 0) return EXIT_FAILURE;

	cur = ftell(file);
	rewind(file);

	while (i < linenumber-1)
	{
		do
		{
			r = fgets(line, sizeof(line), file);
			if (r == NULL) 
			{
				// If fgets() fails, try to go back to initial position.
				clearerr(file);
				fseek(file, cur, SEEK_SET);
				return EXIT_FAILURE;
			}
		} while ((strlen(r) == sizeof(line)-1)&&(r[sizeof(line)-2] != '\n'));
		i++;
	} 

	return EXIT_SUCCESS;
}